

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  Arena *pAVar1;
  Node *this_00;
  bool bVar2;
  Node *pNVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  Tree *tree;
  pair<std::_Rb_tree_iterator<google::protobuf::MapKey_*>,_std::_Rb_tree_iterator<google::protobuf::MapKey_*>_>
  pVar7;
  TreeIterator local_30;
  
  local_30._M_node = (_Base_ptr)0x0;
  bVar2 = iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
          ::revalidate_if_necessary(&it,&local_30);
  sVar5 = it.bucket_index_;
  this_00 = it.node_;
  pNVar3 = (Node *)this->table_[it.bucket_index_];
  if (bVar2) {
    pNVar3 = EraseFromLinkedList(this,it.node_,pNVar3);
    sVar4 = sVar5;
  }
  else {
    pVar7 = std::
            _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
            ::equal_range((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                           *)pNVar3,(key_type *)(local_30._M_node + 1));
    std::
    _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
    ::_M_erase_aux((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                    *)pNVar3,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
    if (pNVar3[1].kv.v_ != (value_type *)0x0) goto LAB_0028c8fe;
    pAVar1 = (this->alloc_).arena_;
    std::
    _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
    ::~_Rb_tree((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                 *)pNVar3);
    if (pAVar1 == (Arena *)0x0) {
      operator_delete(pNVar3);
    }
    sVar4 = sVar5 & 0xfffffffffffffffe;
    *(undefined8 *)((long)this->table_ + (sVar5 << 3 | 8)) = 0;
    pNVar3 = (Node *)0x0;
  }
  this->table_[sVar4] = pNVar3;
  sVar5 = sVar4;
LAB_0028c8fe:
  MapKey::~MapKey((MapKey *)this_00);
  if ((this->alloc_).arena_ == (Arena *)0x0) {
    operator_delete(this_00);
  }
  this->num_elements_ = this->num_elements_ - 1;
  if ((sVar5 == this->index_of_first_non_null_) && (sVar5 < this->num_buckets_)) {
    do {
      uVar6 = sVar5 + 1;
      if (this->table_[sVar5] != (void *)0x0) {
        return;
      }
      this->index_of_first_non_null_ = uVar6;
      sVar5 = uVar6;
    } while (uVar6 != this->num_buckets_);
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }